

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O2

Vec_Int_t * Gia_ManInsePerform(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  abctime aVar5;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  char *pcVar8;
  abctime time;
  abctime time_00;
  uint uVar9;
  int iVar10;
  int Cost;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  abctime local_48;
  Vec_Int_t *vInputs;
  Vec_Int_t *vInit;
  
  local_48 = Abc_Clock();
  Gia_ManRandomW(1);
  if (fVerbose != 0) {
    pcVar8 = "";
    if (vInit0 == (Vec_Int_t *)0x0) {
      pcVar8 = "no ";
    }
    printf("Running with %d frames, %d words, and %sgiven init state.\n",(ulong)(uint)nFrames,
           (ulong)(uint)nWords,pcVar8);
  }
  uVar9 = 0;
  local_50 = vInit0;
  pVVar2 = Vec_IntAlloc(0);
  vInit = pVVar2;
  Vec_IntFill(pVVar2,p->nRegs,2);
  iVar10 = (p->vCis->nSize - p->nRegs) * nFrames;
  pVVar3 = Vec_IntAlloc(iVar10);
  pVVar3->nSize = iVar10;
  memset(pVVar3->pArray,0,(long)iVar10 << 2);
  local_58 = pVVar3;
  vInputs = pVVar3;
  if (p->pData != (void *)0x0) {
    __assert_fail("!p->pData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcInse.c"
                  ,0x21,"void Gia_ParTestAlloc(Gia_Man_t *, int)");
  }
  pvVar4 = malloc((long)p->nObjs * (long)nWords * 0x10);
  p->pData = pvVar4;
  p->iData = nWords;
  Gia_ManInseInit(p,pVVar2);
  for (iVar10 = 0; iVar10 < pVVar2->nSize; iVar10 = iVar10 + 1) {
    uVar1 = Vec_IntEntry(pVVar2,iVar10);
    uVar9 = uVar9 + ((uVar1 >> 1 & 1) != 0);
  }
  if (fVerbose != 0) {
    printf("Frame =%6d : Values =%6d (out of %6d)\n",0,(ulong)uVar9,(ulong)uVar9);
  }
  if (nFrames < 1) {
    nFrames = 0;
  }
  uVar1 = 0;
  do {
    if (uVar1 == nFrames) {
      if (p->pData != (void *)0x0) {
        free(p->pData);
        p->pData = (void *)0x0;
      }
      p->iData = 0;
      pVVar2 = Gia_ManInseSimulate(p,local_50,local_58,pVVar2);
      Vec_IntFreeP(&vInit);
      Vec_IntFreeP(&vInputs);
      printf("After %d frames, found a sequence to produce %d x-values (out of %d).  ",
             (ulong)(uint)nFrames,(ulong)(uint)Cost,(ulong)(uint)p->nRegs);
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x6e51fa,(char *)(aVar5 - local_48),time_00);
      return pVVar2;
    }
    aVar5 = Abc_Clock();
    for (iVar10 = 0; iVar10 < p->nObjs; iVar10 = iVar10 + 1) {
      pGVar6 = Gia_ManObj(p,iVar10);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      Gia_ManInseSimulateObj(p,iVar10);
    }
    iVar10 = Gia_ManInseHighestScore(p,&Cost);
    Gia_ManInseFindStarting(p,iVar10,pVVar2,local_58);
    Gia_ManInseInit(p,pVVar2);
    uVar1 = uVar1 + 1;
    if (fVerbose != 0) {
      printf("Frame =%6d : Values =%6d (out of %6d)   ",(ulong)uVar1,(ulong)(uint)Cost,(ulong)uVar9)
      ;
      aVar7 = Abc_Clock();
      Abc_PrintTime(0x7bf12c,(char *)(aVar7 - aVar5),time);
    }
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManInsePerform( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int fVerbose )
{
    Vec_Int_t * vRes, * vInit, * vInputs;
    Gia_Obj_t * pObj;
    int i, f, iPat, Cost, Cost0;
    abctime clk, clkTotal = Abc_Clock();
    Gia_ManRandomW( 1 );
    if ( fVerbose )
        printf( "Running with %d frames, %d words, and %sgiven init state.\n", nFrames, nWords, vInit0 ? "":"no " );
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 2 );
    vInputs = Vec_IntStart( Gia_ManPiNum(p) * nFrames );
    Gia_ParTestAlloc( p, nWords );
    Gia_ManInseInit( p, vInit );
    Cost0 = 0;
    Vec_IntForEachEntry( vInit, iPat, i )
        Cost0 += ((iPat >> 1) & 1);
    if ( fVerbose )
        printf( "Frame =%6d : Values =%6d (out of %6d)\n", 0, Cost0, Cost0 );
    for ( f = 0; f < nFrames; f++ )
    {
        clk = Abc_Clock();
        Gia_ManForEachObj( p, pObj, i )
            Gia_ManInseSimulateObj( p, i );
        iPat = Gia_ManInseHighestScore( p, &Cost );
        Gia_ManInseFindStarting( p, iPat, vInit, vInputs );
        Gia_ManInseInit( p, vInit );
        if ( fVerbose )
            printf( "Frame =%6d : Values =%6d (out of %6d)   ", f+1, Cost, Cost0 );
        if ( fVerbose )
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Gia_ParTestFree( p );
    vRes = Gia_ManInseSimulate( p, vInit0, vInputs, vInit );
    Vec_IntFreeP( &vInit );
    Vec_IntFreeP( &vInputs );
    printf( "After %d frames, found a sequence to produce %d x-values (out of %d).  ", f, Cost, Gia_ManRegNum(p) );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vRes;
}